

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

void gnu_clear_sparse_list(tar *tar)

{
  sparse_block *__ptr;
  
  while (__ptr = tar->sparse_list, __ptr != (sparse_block *)0x0) {
    tar->sparse_list = __ptr->next;
    free(__ptr);
  }
  tar->sparse_last = (sparse_block *)0x0;
  return;
}

Assistant:

static void
gnu_clear_sparse_list(struct tar *tar)
{
	struct sparse_block *p;

	while (tar->sparse_list != NULL) {
		p = tar->sparse_list;
		tar->sparse_list = p->next;
		free(p);
	}
	tar->sparse_last = NULL;
}